

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

bool __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
can_be_inserted(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                *this,size_t hash,double value)

{
  double dVar1;
  pointer prVar2;
  long lVar3;
  long lVar4;
  m_indices_reader lock;
  shared_lock<std::shared_mutex> local_20;
  
  local_20._M_owns = true;
  local_20._M_pm = &this->m_indices_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  prVar2 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (ulong)(uint)this->m_size * 0x38;
  for (lVar4 = 0; lVar3 - lVar4 != 0; lVar4 = lVar4 + 0x38) {
    if (*(int *)((long)&prVar2->remaining_constraints + lVar4) == 0) {
      dVar1 = *(double *)((long)&prVar2->value + lVar4);
      if (((dVar1 == value) && (!NAN(dVar1) && !NAN(value))) &&
         (*(size_t *)((long)&prVar2->hash + lVar4) == hash)) break;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20);
  return lVar3 - lVar4 == 0;
}

Assistant:

bool can_be_inserted([[maybe_unused]] const std::size_t hash,
                         const double value) const noexcept
    {
        m_indices_reader lock(m_indices_mutex);

        for (int i = 0; i != m_size; ++i)
            if (m_data[i].remaining_constraints == 0 &&
                m_data[i].value == value && m_data[i].hash == hash)
                return false;

        return true;
    }